

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O0

int setsockettimeouts(SOCKET sock,int timeout)

{
  long lStack_20;
  int iOptLen;
  timeval tv;
  int timeout_local;
  SOCKET sock_local;
  
  lStack_20 = (long)(timeout / 1000);
  tv.tv_sec = (__time_t)((timeout % 1000) * 1000);
  tv.tv_usec._0_4_ = timeout;
  tv.tv_usec._4_4_ = sock;
  setsockopt(sock,1,0x15,&stack0xffffffffffffffe0,0x10);
  setsockopt(tv.tv_usec._4_4_,1,0x14,&stack0xffffffffffffffe0,0x10);
  return 0;
}

Assistant:

inline int setsockettimeouts(SOCKET sock, int timeout)
{
#ifdef _WIN32
	int iOptVal = 0;
#else
	struct timeval tv;
#endif // _WIN32
	int iOptLen = 0;

#ifdef _WIN32
	iOptVal = timeout; // In ms.
	iOptLen = sizeof(int);
	if (setsockopt(sock, SOL_SOCKET, SO_SNDTIMEO, (char*)&iOptVal, iOptLen) == SOCKET_ERROR) 
	{
		PRINT_DEBUG_WARNING_OSNET(("setsockettimeouts warning (%s) : %s(sock=%d, timeout=%d)\n", 
			strtime_m(), 
			"setsockopt failed. ", 
			(int)sock, timeout));
		//return EXIT_FAILURE;
	}
	if (setsockopt(sock, SOL_SOCKET, SO_RCVTIMEO, (char*)&iOptVal, iOptLen) == SOCKET_ERROR) 
	{
		PRINT_DEBUG_WARNING_OSNET(("setsockettimeouts warning (%s) : %s(sock=%d, timeout=%d)\n", 
			strtime_m(), 
			"setsockopt failed. ", 
			(int)sock, timeout));
		//return EXIT_FAILURE;
	}
#else
	tv.tv_sec = (long)(timeout/1000);
	tv.tv_usec = (long)((timeout%1000)*1000);
	iOptLen = sizeof(struct timeval);
	if (setsockopt(sock, SOL_SOCKET, SO_SNDTIMEO, (char*)&tv, iOptLen) == SOCKET_ERROR)
	{
		PRINT_DEBUG_WARNING_OSNET(("setsockettimeouts warning (%s) : %s(sock=%d, timeout=%d)\n", 
			strtime_m(), 
			"setsockopt failed. ", 
			(int)sock, timeout));
		//return EXIT_FAILURE;
	}
	if (setsockopt(sock, SOL_SOCKET, SO_RCVTIMEO, (char*)&tv, iOptLen) == SOCKET_ERROR)
	{
		PRINT_DEBUG_WARNING_OSNET(("setsockettimeouts warning (%s) : %s(sock=%d, timeout=%d)\n", 
			strtime_m(), 
			"setsockopt failed. ", 
			(int)sock, timeout));
		//return EXIT_FAILURE;
	}
#endif // _WIN32

	return EXIT_SUCCESS;
}